

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O1

bool __thiscall ritobin::io::impl_text_read::TextReader::read_bool(TextReader *this,bool *value)

{
  bool bVar1;
  int iVar2;
  size_type __rlen;
  string_view sVar3;
  
  sVar3 = read_word(this);
  if (sVar3._M_len == 5) {
    iVar2 = bcmp(sVar3._M_str,"false",5);
    bVar1 = false;
    if (iVar2 != 0) {
      return false;
    }
  }
  else {
    if ((sVar3._M_len != 4) || (iVar2 = bcmp(sVar3._M_str,"true",4), iVar2 != 0)) {
      return false;
    }
    bVar1 = true;
  }
  *value = bVar1;
  return true;
}

Assistant:

bool read_bool(bool& value) noexcept {
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            if (word == "true") {
                value = true;
                return true;
            }
            else if (word == "false") {
                value = false;
                return true;
            }
            else {
                return false;
            }
        }